

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O0

size_t __thiscall duckdb::WindowNaiveState::Hash(WindowNaiveState *this,idx_t rid)

{
  pointer pWVar1;
  unsigned_long *puVar2;
  sel_t *in_RDI;
  idx_t in_stack_00000020;
  idx_t in_stack_00000028;
  SelectionVector *in_stack_00000030;
  DataChunk *in_stack_00000038;
  SelectionVector sel;
  DataChunk *scanned;
  sel_t s;
  idx_t in_stack_ffffffffffffff88;
  WindowCursor *in_stack_ffffffffffffff90;
  unsigned_long uVar3;
  Vector *in_stack_ffffffffffffffb8;
  DataChunk *in_stack_ffffffffffffffc0;
  SelectionVector local_38;
  DataChunk *local_20;
  sel_t local_14;
  
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             in_stack_ffffffffffffff90);
  local_14 = WindowCursor::RowOffset(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pWVar1 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                       *)in_stack_ffffffffffffff90);
  local_20 = &pWVar1->chunk;
  SelectionVector::SelectionVector(&local_38,in_RDI);
  DataChunk::Slice((DataChunk *)sel.sel_vector,in_stack_00000038,in_stack_00000030,in_stack_00000028
                   ,in_stack_00000020);
  DataChunk::Hash(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  puVar2 = FlatVector::GetData<unsigned_long>((Vector *)0x1a3fca5);
  uVar3 = *puVar2;
  SelectionVector::~SelectionVector((SelectionVector *)0x1a3fcc3);
  return uVar3;
}

Assistant:

size_t WindowNaiveState::Hash(idx_t rid) {
	D_ASSERT(cursor->RowIsVisible(rid));
	auto s = cursor->RowOffset(rid);
	auto &scanned = cursor->chunk;
	SelectionVector sel(&s);
	leaves.Slice(scanned, sel, 1);
	leaves.Hash(hashes);

	return *FlatVector::GetData<hash_t>(hashes);
}